

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall
leveldb::DBTest_RepeatedWritesToSameKey_Test::TestBody(DBTest_RepeatedWritesToSameKey_Test *this)

{
  DB *pDVar1;
  FILE *__stream;
  int iVar2;
  char *__end;
  int level;
  int iVar3;
  _func_int **pp_Var4;
  int level_1;
  int result;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int kMaxFiles;
  AssertionResult gtest_ar;
  Random rnd;
  string value;
  Options options;
  undefined1 local_109;
  uint local_108;
  int local_104;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  DBTest_RepeatedWritesToSameKey_Test *pDStack_f8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [16];
  void *local_e0;
  Message local_d8;
  DBTest_RepeatedWritesToSameKey_Test *pDStack_d0;
  AssertHelper local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  Random local_b4;
  string local_b0;
  Options local_90;
  
  DBTest::CurrentOptions(&local_90,&this->super_DBTest);
  local_90.env = (Env *)(this->super_DBTest).env_;
  local_90.write_buffer_size = 100000;
  DBTest::Reopen(&this->super_DBTest,&local_90);
  local_104 = 0x13;
  local_b4.seed_ = 0x12d;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  test::RandomString(&local_b4,(int)local_90.write_buffer_size * 2,&local_b0);
  local_108 = 0;
  while( true ) {
    local_100._M_head_impl = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"key","");
    pDVar1 = (this->super_DBTest).db_;
    local_109 = 0;
    local_d8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )local_100._M_head_impl;
    pDStack_d0 = pDStack_f8;
    local_c8.data_._0_4_ = local_b0._M_dataplus._M_p._0_4_;
    local_c8.data_._4_4_ = local_b0._M_dataplus._M_p._4_4_;
    uStack_c0 = (undefined4)local_b0._M_string_length;
    uStack_bc = local_b0._M_string_length._4_4_;
    (*pDVar1->_vptr_DB[2])(&local_e0,pDVar1,&local_109,&local_d8,&local_c8);
    if (local_e0 != (void *)0x0) {
      operator_delete__(local_e0);
    }
    if (local_100._M_head_impl != local_f0) {
      operator_delete(local_100._M_head_impl);
    }
    iVar3 = 0;
    iVar5 = 0;
    do {
      iVar2 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,iVar3);
      iVar5 = iVar5 + iVar2;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 7);
    local_d8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = iVar5;
    testing::internal::CmpHelperLE<int,int>
              ((internal *)&local_100,"TotalTableFiles()","kMaxFiles",(int *)&local_d8,&local_104);
    if (local_100._M_head_impl._0_1_ == (internal)0x0) break;
    if (pDStack_f8 != (DBTest_RepeatedWritesToSameKey_Test *)0x0) {
      TestBody(pDStack_f8);
    }
    __stream = _stderr;
    iVar3 = 0;
    uVar6 = 0;
    do {
      iVar5 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,iVar3);
      uVar6 = uVar6 + iVar5;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 7);
    uVar7 = local_108 + 1;
    fprintf(__stream,"after %d: %d files\n",(ulong)uVar7,(ulong)uVar6);
    local_108 = uVar7;
    if (uVar7 == 0x5f) {
LAB_0011f324:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      return;
    }
  }
  testing::Message::Message(&local_d8);
  if (pDStack_f8 == (DBTest_RepeatedWritesToSameKey_Test *)0x0) {
    pp_Var4 = (_func_int **)0x185725;
  }
  else {
    pp_Var4 = (pDStack_f8->super_DBTest).super_Test._vptr_Test;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
             ,0x460,(char *)pp_Var4);
  testing::internal::AssertHelper::operator=(&local_c8,&local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (local_d8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_d8.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (pDStack_f8 != (DBTest_RepeatedWritesToSameKey_Test *)0x0) {
    pp_Var4 = (pDStack_f8->super_DBTest).super_Test._vptr_Test;
    if ((string *)pp_Var4 != &(pDStack_f8->super_DBTest).dbname_) {
      operator_delete(pp_Var4);
    }
    operator_delete(pDStack_f8);
  }
  goto LAB_0011f324;
}

Assistant:

TEST_F(DBTest, RepeatedWritesToSameKey) {
  Options options = CurrentOptions();
  options.env = env_;
  options.write_buffer_size = 100000;  // Small write buffer
  Reopen(&options);

  // We must have at most one file per level except for level-0,
  // which may have up to kL0_StopWritesTrigger files.
  const int kMaxFiles = config::kNumLevels + config::kL0_StopWritesTrigger;

  Random rnd(301);
  std::string value = RandomString(&rnd, 2 * options.write_buffer_size);
  for (int i = 0; i < 5 * kMaxFiles; i++) {
    Put("key", value);
    ASSERT_LE(TotalTableFiles(), kMaxFiles);
    std::fprintf(stderr, "after %d: %d files\n", i + 1, TotalTableFiles());
  }
}